

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O1

void __thiscall BRTS_XZ<UF>::InitCompressedData(BRTS_XZ<UF> *this,Data_Compressed *data_compressed)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Mat1b *pMVar4;
  uint64_t *puVar5;
  long lVar6;
  long *plVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint64_t *puVar13;
  ulong uVar14;
  uint64_t uVar15;
  uint64_t *puVar16;
  long lVar17;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar1 = *(int *)&pMVar4->field_0x8;
  if (0 < (long)iVar1) {
    uVar2 = *(uint *)&pMVar4->field_0xc;
    puVar5 = data_compressed->bits;
    iVar3 = data_compressed->data_width;
    lVar6 = *(long *)&pMVar4->field_0x10;
    plVar7 = *(long **)&pMVar4->field_0x48;
    uVar9 = uVar2 + 0x3f;
    if (-1 < (int)uVar2) {
      uVar9 = uVar2;
    }
    lVar17 = 0;
    puVar16 = puVar5;
    do {
      lVar8 = *plVar7;
      if ((int)uVar2 >> 6 < 1) {
        puVar13 = puVar5 + lVar17 * iVar3;
      }
      else {
        lVar10 = lVar8 * lVar17 + lVar6 + 0x3f;
        lVar12 = 0;
        do {
          uVar14 = (ulong)(*(char *)(lVar10 + -0x3f + lVar12 * 8) != '\0');
          uVar11 = uVar14 + 2;
          if (*(char *)(lVar10 + -0x3e + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 + 4;
          if (*(char *)(lVar10 + -0x3d + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 + 8;
          if (*(char *)(lVar10 + -0x3c + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x10;
          if (*(char *)(lVar10 + -0x3b + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x20;
          if (*(char *)(lVar10 + -0x3a + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x40;
          if (*(char *)(lVar10 + -0x39 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x80;
          if (*(char *)(lVar10 + -0x38 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x100;
          if (*(char *)(lVar10 + -0x37 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x200;
          if (*(char *)(lVar10 + -0x36 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x400;
          if (*(char *)(lVar10 + -0x35 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x800;
          if (*(char *)(lVar10 + -0x34 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x1000;
          if (*(char *)(lVar10 + -0x33 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x2000;
          if (*(char *)(lVar10 + -0x32 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x4000;
          if (*(char *)(lVar10 + -0x31 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x8000;
          if (*(char *)(lVar10 + -0x30 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x10000;
          if (*(char *)(lVar10 + -0x2f + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x20000;
          if (*(char *)(lVar10 + -0x2e + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x40000;
          if (*(char *)(lVar10 + -0x2d + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x80000;
          if (*(char *)(lVar10 + -0x2c + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x100000;
          if (*(char *)(lVar10 + -0x2b + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x200000;
          if (*(char *)(lVar10 + -0x2a + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x400000;
          if (*(char *)(lVar10 + -0x29 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x800000;
          if (*(char *)(lVar10 + -0x28 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x1000000;
          if (*(char *)(lVar10 + -0x27 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x2000000;
          if (*(char *)(lVar10 + -0x26 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x4000000;
          if (*(char *)(lVar10 + -0x25 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x8000000;
          if (*(char *)(lVar10 + -0x24 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x10000000;
          if (*(char *)(lVar10 + -0x23 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x20000000;
          if (*(char *)(lVar10 + -0x22 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x40000000;
          if (*(char *)(lVar10 + -0x21 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x80000000;
          if (*(char *)(lVar10 + -0x20 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x100000000;
          if (*(char *)(lVar10 + -0x1f + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x200000000;
          if (*(char *)(lVar10 + -0x1e + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x400000000;
          if (*(char *)(lVar10 + -0x1d + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x800000000;
          if (*(char *)(lVar10 + -0x1c + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x1000000000;
          if (*(char *)(lVar10 + -0x1b + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x2000000000;
          if (*(char *)(lVar10 + -0x1a + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x4000000000;
          if (*(char *)(lVar10 + -0x19 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x8000000000;
          if (*(char *)(lVar10 + -0x18 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x10000000000;
          if (*(char *)(lVar10 + -0x17 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x20000000000;
          if (*(char *)(lVar10 + -0x16 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x40000000000;
          if (*(char *)(lVar10 + -0x15 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x80000000000;
          if (*(char *)(lVar10 + -0x14 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x100000000000;
          if (*(char *)(lVar10 + -0x13 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x200000000000;
          if (*(char *)(lVar10 + -0x12 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x400000000000;
          if (*(char *)(lVar10 + -0x11 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x800000000000;
          if (*(char *)(lVar10 + -0x10 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x1000000000000;
          if (*(char *)(lVar10 + -0xf + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x2000000000000;
          if (*(char *)(lVar10 + -0xe + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x4000000000000;
          if (*(char *)(lVar10 + -0xd + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x8000000000000;
          if (*(char *)(lVar10 + -0xc + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x10000000000000;
          if (*(char *)(lVar10 + -0xb + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x20000000000000;
          if (*(char *)(lVar10 + -10 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x40000000000000;
          if (*(char *)(lVar10 + -9 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x80000000000000;
          if (*(char *)(lVar10 + -8 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x100000000000000;
          if (*(char *)(lVar10 + -7 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x200000000000000;
          if (*(char *)(lVar10 + -6 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x400000000000000;
          if (*(char *)(lVar10 + -5 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x800000000000000;
          if (*(char *)(lVar10 + -4 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x1000000000000000;
          if (*(char *)(lVar10 + -3 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x2000000000000000;
          if (*(char *)(lVar10 + -2 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          uVar14 = uVar11 | 0x4000000000000000;
          if (*(char *)(lVar10 + -1 + lVar12 * 8) == '\0') {
            uVar14 = uVar11;
          }
          uVar11 = uVar14 | 0x8000000000000000;
          if (*(char *)(lVar10 + lVar12 * 8) == '\0') {
            uVar11 = uVar14;
          }
          *(ulong *)((long)puVar16 + lVar12) = uVar11;
          lVar12 = lVar12 + 8;
        } while ((ulong)(uint)((int)uVar2 >> 6) * 8 - lVar12 != 0);
        puVar13 = (uint64_t *)(lVar12 + (long)puVar16);
      }
      if ((int)uVar2 % 0x40 < 1) {
        uVar15 = 0;
      }
      else {
        uVar11 = 0;
        uVar15 = 0;
        do {
          uVar14 = 0;
          if (*(char *)(lVar8 * lVar17 + (int)(uVar9 & 0xffffffc0) + lVar6 + uVar11) != '\0') {
            uVar14 = 1L << ((byte)uVar11 & 0x3f);
          }
          uVar15 = uVar15 | uVar14;
          uVar11 = uVar11 + 1;
        } while ((uint)((int)uVar2 % 0x40) != uVar11);
      }
      *puVar13 = uVar15;
      lVar17 = lVar17 + 1;
      puVar16 = puVar16 + iVar3;
    } while (lVar17 != iVar1);
  }
  return;
}

Assistant:

void InitCompressedData(Data_Compressed& data_compressed) {
        int w(img_.cols);
        int h(img_.rows);

        for (int i = 0; i < h; i++) {
            uint64_t* mbits = data_compressed[i];
            uchar* source = img_.ptr<uchar>(i);
            for (int j = 0; j < w >> 6; j++) {
                uchar* base = source + (j << 6);
                uint64_t obits = 0;
                if (base[0]) obits |= 0x0000000000000001;
                if (base[1]) obits |= 0x0000000000000002;
                if (base[2]) obits |= 0x0000000000000004;
                if (base[3]) obits |= 0x0000000000000008;
                if (base[4]) obits |= 0x0000000000000010;
                if (base[5]) obits |= 0x0000000000000020;
                if (base[6]) obits |= 0x0000000000000040;
                if (base[7]) obits |= 0x0000000000000080;
                if (base[8]) obits |= 0x0000000000000100;
                if (base[9]) obits |= 0x0000000000000200;
                if (base[10]) obits |= 0x0000000000000400;
                if (base[11]) obits |= 0x0000000000000800;
                if (base[12]) obits |= 0x0000000000001000;
                if (base[13]) obits |= 0x0000000000002000;
                if (base[14]) obits |= 0x0000000000004000;
                if (base[15]) obits |= 0x0000000000008000;
                if (base[16]) obits |= 0x0000000000010000;
                if (base[17]) obits |= 0x0000000000020000;
                if (base[18]) obits |= 0x0000000000040000;
                if (base[19]) obits |= 0x0000000000080000;
                if (base[20]) obits |= 0x0000000000100000;
                if (base[21]) obits |= 0x0000000000200000;
                if (base[22]) obits |= 0x0000000000400000;
                if (base[23]) obits |= 0x0000000000800000;
                if (base[24]) obits |= 0x0000000001000000;
                if (base[25]) obits |= 0x0000000002000000;
                if (base[26]) obits |= 0x0000000004000000;
                if (base[27]) obits |= 0x0000000008000000;
                if (base[28]) obits |= 0x0000000010000000;
                if (base[29]) obits |= 0x0000000020000000;
                if (base[30]) obits |= 0x0000000040000000;
                if (base[31]) obits |= 0x0000000080000000;
                if (base[32]) obits |= 0x0000000100000000;
                if (base[33]) obits |= 0x0000000200000000;
                if (base[34]) obits |= 0x0000000400000000;
                if (base[35]) obits |= 0x0000000800000000;
                if (base[36]) obits |= 0x0000001000000000;
                if (base[37]) obits |= 0x0000002000000000;
                if (base[38]) obits |= 0x0000004000000000;
                if (base[39]) obits |= 0x0000008000000000;
                if (base[40]) obits |= 0x0000010000000000;
                if (base[41]) obits |= 0x0000020000000000;
                if (base[42]) obits |= 0x0000040000000000;
                if (base[43]) obits |= 0x0000080000000000;
                if (base[44]) obits |= 0x0000100000000000;
                if (base[45]) obits |= 0x0000200000000000;
                if (base[46]) obits |= 0x0000400000000000;
                if (base[47]) obits |= 0x0000800000000000;
                if (base[48]) obits |= 0x0001000000000000;
                if (base[49]) obits |= 0x0002000000000000;
                if (base[50]) obits |= 0x0004000000000000;
                if (base[51]) obits |= 0x0008000000000000;
                if (base[52]) obits |= 0x0010000000000000;
                if (base[53]) obits |= 0x0020000000000000;
                if (base[54]) obits |= 0x0040000000000000;
                if (base[55]) obits |= 0x0080000000000000;
                if (base[56]) obits |= 0x0100000000000000;
                if (base[57]) obits |= 0x0200000000000000;
                if (base[58]) obits |= 0x0400000000000000;
                if (base[59]) obits |= 0x0800000000000000;
                if (base[60]) obits |= 0x1000000000000000;
                if (base[61]) obits |= 0x2000000000000000;
                if (base[62]) obits |= 0x4000000000000000;
                if (base[63]) obits |= 0x8000000000000000;
                *mbits = obits, mbits++;
            }
            uint64_t obits_final = 0;
            int jbase = w - (w % 64);
            for (int j = 0; j < w % 64; j++) {
                if (source[jbase + j]) obits_final |= ((uint64_t)1 << j);
            }
            *mbits = obits_final;
        }
    }